

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * MemBackendAlloc(SyMemBackend *pBackend,sxu32 nByte)

{
  int iVar1;
  SyMemBlock *pSVar2;
  int local_2c;
  sxi32 nRetry;
  SyMemBlock *pBlock;
  sxu32 nByte_local;
  SyMemBackend *pBackend_local;
  
  local_2c = 0;
  while( true ) {
    pSVar2 = (SyMemBlock *)(*pBackend->pMethods->xAlloc)(nByte + 0x10);
    if (((pSVar2 != (SyMemBlock *)0x0) || (pBackend->xMemError == (ProcMemError)0x0)) ||
       (3 < local_2c)) break;
    iVar1 = (*pBackend->xMemError)(pBackend->pUserData);
    if (iVar1 != -0x21) break;
    local_2c = local_2c + 1;
  }
  if (pSVar2 == (SyMemBlock *)0x0) {
    pBackend_local = (SyMemBackend *)0x0;
  }
  else {
    pSVar2->pPrev = (SyMemBlock *)0x0;
    pSVar2->pNext = (SyMemBlock *)0x0;
    if (pBackend->pBlocks == (SyMemBlock *)0x0) {
      pBackend->pBlocks = pSVar2;
    }
    else {
      pSVar2->pNext = pBackend->pBlocks;
      pBackend->pBlocks->pPrev = pSVar2;
      pBackend->pBlocks = pSVar2;
    }
    pBackend->nBlock = pBackend->nBlock + 1;
    pBackend_local = (SyMemBackend *)(pSVar2 + 1);
  }
  return pBackend_local;
}

Assistant:

static void * MemBackendAlloc(SyMemBackend *pBackend, sxu32 nByte)
{
	SyMemBlock *pBlock;
	sxi32 nRetry = 0;

	/* Append an extra block so we can tracks allocated chunks and avoid memory
	 * leaks.
	 */
	nByte += sizeof(SyMemBlock);
	for(;;){
		pBlock = (SyMemBlock *)pBackend->pMethods->xAlloc(nByte);
		if( pBlock != 0 || pBackend->xMemError == 0 || nRetry > SXMEM_BACKEND_RETRY 
			|| SXERR_RETRY != pBackend->xMemError(pBackend->pUserData) ){
				break;
		}
		nRetry++;
	}
	if( pBlock  == 0 ){
		return 0;
	}
	pBlock->pNext = pBlock->pPrev = 0;
	/* Link to the list of already tracked blocks */
	MACRO_LD_PUSH(pBackend->pBlocks, pBlock);
#if defined(UNTRUST)
	pBlock->nGuard = SXMEM_BACKEND_MAGIC;
#endif
	pBackend->nBlock++;
	return (void *)&pBlock[1];
}